

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_checkbox_text(nk_context *ctx,char *text,int len,int *active)

{
  int iVar1;
  int iVar2;
  int old_val;
  int *active_local;
  int len_local;
  char *text_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4f77,"int nk_checkbox_text(struct nk_context *, const char *, int, int *)");
  }
  if (text != (char *)0x0) {
    if (active != (int *)0x0) {
      if (((ctx == (nk_context *)0x0) || (text == (char *)0x0)) || (active == (int *)0x0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = *active;
        iVar2 = nk_check_text(ctx,text,len,*active);
        *active = iVar2;
        ctx_local._4_4_ = (uint)(iVar1 != *active);
      }
      return ctx_local._4_4_;
    }
    __assert_fail("active",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4f79,"int nk_checkbox_text(struct nk_context *, const char *, int, int *)");
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4f78,"int nk_checkbox_text(struct nk_context *, const char *, int, int *)");
}

Assistant:

NK_API int
nk_checkbox_text(struct nk_context *ctx, const char *text, int len, int *active)
{
    int old_val;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    NK_ASSERT(active);
    if (!ctx || !text || !active) return 0;
    old_val = *active;
    *active = nk_check_text(ctx, text, len, *active);
    return old_val != *active;
}